

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O3

_Bool av1_cnn_predict_img_multi_out_highbd
                (uint16_t **dgd,int width,int height,int stride,CNN_CONFIG *cnn_config,
                CNN_THREAD_DATA *thread_data,int bit_depth,CNN_MULTI_OUT *output)

{
  long lVar1;
  float *pfVar2;
  size_t __n;
  float fVar3;
  uint uVar4;
  uint uVar5;
  uint16_t *puVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  _Bool _Var11;
  int iVar12;
  void *memblk;
  long lVar13;
  long lVar14;
  ulong uVar15;
  int in_width;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  int in_height;
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int j;
  float *inputs [256];
  float *local_838 [257];
  
  lVar13 = (long)width;
  lVar1 = lVar13 + (long)cnn_config->ext_width * 2;
  uVar4 = cnn_config->layer_config[0].in_channels;
  in_height = height + cnn_config->ext_height * 2;
  in_width = (int)lVar1;
  iVar12 = in_height * in_width;
  memblk = aom_malloc((long)(int)(iVar12 * uVar4) << 2);
  if (memblk == (void *)0x0) {
    _Var11 = false;
  }
  else {
    if (0 < (int)uVar4) {
      fVar28 = (float)~(-1 << ((byte)bit_depth & 0x1f));
      __n = lVar1 * 4;
      iVar23 = cnn_config->ext_height;
      lVar7 = (long)stride * 2;
      iVar21 = 0;
      uVar15 = 0;
      do {
        auVar10 = _DAT_004c8110;
        auVar9 = _DAT_004c8100;
        auVar8 = _DAT_004c80f0;
        lVar18 = (long)iVar21 * 4;
        pfVar2 = (float *)((long)memblk + (long)(iVar12 * (int)uVar15) * 4);
        local_838[uVar15] = pfVar2;
        lVar20 = (long)(iVar23 * in_width);
        uVar5 = cnn_config->ext_width;
        lVar14 = (long)(int)uVar5;
        if (cnn_config->strict_bounds == 0) {
          iVar25 = -iVar23;
          iVar24 = iVar23 + height;
          if (iVar24 != iVar25 && SBORROW4(iVar24,iVar25) == iVar24 + iVar23 < 0) {
            lVar18 = ((lVar18 + lVar20 * 4) - __n * (long)iVar23) + (long)memblk;
            lVar14 = (long)iVar23 * (long)stride * -2 + lVar14 * -2;
            iVar19 = uVar5 + width;
            do {
              if (iVar19 != -uVar5 && SBORROW4(iVar19,-uVar5) == (int)(iVar19 + uVar5) < 0) {
                puVar6 = dgd[uVar15];
                lVar20 = 0;
                do {
                  *(float *)(lVar18 + lVar20 * 4) =
                       (float)*(ushort *)((long)puVar6 + lVar20 * 2 + lVar14) / fVar28;
                  lVar20 = lVar20 + 1;
                } while (width + uVar5 * 2 != (int)lVar20);
              }
              iVar25 = iVar25 + 1;
              lVar18 = lVar18 + __n;
              lVar14 = lVar14 + lVar7;
            } while (iVar24 != iVar25);
          }
        }
        else {
          if (0 < height) {
            lVar16 = lVar18 + lVar14 * 4 + lVar20 * 4 + (long)memblk;
            lVar17 = 0;
            uVar22 = 0;
            do {
              if (0 < width) {
                puVar6 = dgd[uVar15];
                uVar26 = 0;
                do {
                  *(float *)(lVar16 + uVar26 * 4) =
                       (float)*(ushort *)((long)puVar6 + uVar26 * 2 + lVar17) / fVar28;
                  uVar26 = uVar26 + 1;
                } while ((uint)width != uVar26);
              }
              uVar22 = uVar22 + 1;
              lVar16 = lVar16 + __n;
              lVar17 = lVar17 + lVar7;
            } while (uVar22 != (uint)height);
            if (0 < height) {
              lVar16 = (long)(int)(uVar5 + width);
              if ((long)(int)(uVar5 + width) < lVar13 + 1) {
                lVar16 = lVar13 + 1;
              }
              lVar17 = (ulong)uVar5 - 1;
              auVar27._8_4_ = (int)lVar17;
              auVar27._0_8_ = lVar17;
              auVar27._12_4_ = (int)((ulong)lVar17 >> 0x20);
              lVar17 = (lVar16 - lVar13) + -1;
              auVar29._8_4_ = (int)lVar17;
              auVar29._0_8_ = lVar17;
              auVar29._12_4_ = (int)((ulong)lVar17 >> 0x20);
              lVar18 = lVar14 * 4 + lVar18 + lVar20 * 4;
              lVar17 = (long)memblk + lVar18 + (long)(int)-uVar5 * 4 + 0xc;
              lVar18 = (long)memblk + lVar18 + lVar13 * 4 + 0xc;
              auVar27 = auVar27 ^ auVar10;
              uVar22 = 0;
              do {
                if (0 < (int)uVar5) {
                  fVar3 = pfVar2[lVar20 + lVar14 + uVar22 * lVar1];
                  uVar26 = 0;
                  do {
                    auVar30._8_4_ = (int)uVar26;
                    auVar30._0_8_ = uVar26;
                    auVar30._12_4_ = (int)(uVar26 >> 0x20);
                    auVar31 = (auVar30 | auVar9) ^ auVar10;
                    iVar24 = auVar27._4_4_;
                    if ((bool)(~(iVar24 < auVar31._4_4_ ||
                                auVar27._0_4_ < auVar31._0_4_ && auVar31._4_4_ == iVar24) & 1)) {
                      *(float *)(lVar17 + -0xc + uVar26 * 4) = fVar3;
                    }
                    if (auVar31._12_4_ <= auVar27._12_4_ &&
                        (auVar31._8_4_ <= auVar27._8_4_ || auVar31._12_4_ != auVar27._12_4_)) {
                      *(float *)(lVar17 + -8 + uVar26 * 4) = fVar3;
                    }
                    auVar30 = (auVar30 | auVar8) ^ auVar10;
                    iVar25 = auVar30._4_4_;
                    if (iVar25 <= iVar24 && (iVar25 != iVar24 || auVar30._0_4_ <= auVar27._0_4_)) {
                      *(float *)(lVar17 + -4 + uVar26 * 4) = fVar3;
                      *(float *)(lVar17 + uVar26 * 4) = fVar3;
                    }
                    uVar26 = uVar26 + 4;
                  } while ((uVar5 + 3 & 0xfffffffc) != uVar26);
                  if (0 < (int)uVar5) {
                    fVar3 = pfVar2[lVar20 + lVar14 + lVar13 + uVar22 * lVar1 + -1];
                    uVar26 = 0;
                    do {
                      auVar31._8_4_ = (int)uVar26;
                      auVar31._0_8_ = uVar26;
                      auVar31._12_4_ = (int)(uVar26 >> 0x20);
                      auVar30 = auVar29 ^ auVar10;
                      auVar32 = (auVar31 | auVar9) ^ auVar10;
                      iVar24 = auVar30._4_4_;
                      if ((bool)(~(iVar24 < auVar32._4_4_ ||
                                  auVar30._0_4_ < auVar32._0_4_ && auVar32._4_4_ == iVar24) & 1)) {
                        *(float *)(lVar18 + -0xc + uVar26 * 4) = fVar3;
                      }
                      if (auVar32._12_4_ <= auVar30._12_4_ &&
                          (auVar32._8_4_ <= auVar30._8_4_ || auVar32._12_4_ != auVar30._12_4_)) {
                        *(float *)(lVar18 + -8 + uVar26 * 4) = fVar3;
                      }
                      auVar31 = (auVar31 | auVar8) ^ auVar10;
                      iVar25 = auVar31._4_4_;
                      if (iVar25 <= iVar24 && (iVar25 != iVar24 || auVar31._0_4_ <= auVar30._0_4_))
                      {
                        *(float *)(lVar18 + -4 + uVar26 * 4) = fVar3;
                        *(float *)(lVar18 + uVar26 * 4) = fVar3;
                      }
                      uVar26 = uVar26 + 4;
                    } while (((lVar16 - lVar13) + 3U & 0xfffffffffffffffc) != uVar26);
                  }
                }
                uVar22 = uVar22 + 1;
                lVar17 = lVar17 + __n;
                lVar18 = lVar18 + __n;
              } while (uVar22 != (uint)height);
            }
          }
          if (0 < iVar23) {
            iVar24 = -in_width * iVar23;
            do {
              memcpy(pfVar2 + lVar20 + lVar14 + (iVar24 - cnn_config->ext_width),
                     pfVar2 + lVar20 + (lVar14 - cnn_config->ext_width),__n);
              iVar24 = iVar24 + in_width;
              iVar23 = iVar23 + -1;
            } while (iVar23 != 0);
            iVar23 = cnn_config->ext_height;
          }
          iVar24 = height * in_width;
          iVar25 = height;
          if (0 < iVar23) {
            do {
              memcpy(pfVar2 + lVar20 + lVar14 + (iVar24 - cnn_config->ext_width),
                     pfVar2 + lVar20 + lVar14 + ((height + -1) * in_width - cnn_config->ext_width),
                     __n);
              iVar25 = iVar25 + 1;
              iVar23 = cnn_config->ext_height;
              iVar24 = iVar24 + in_width;
            } while (iVar25 < iVar23 + height);
          }
        }
        uVar15 = uVar15 + 1;
        iVar21 = iVar21 + iVar12;
      } while (uVar15 != uVar4);
    }
    _Var11 = av1_cnn_predict_c(local_838,in_width,in_height,in_width,cnn_config,thread_data,output);
    aom_free(memblk);
  }
  return _Var11;
}

Assistant:

bool av1_cnn_predict_img_multi_out_highbd(uint16_t **dgd, int width, int height,
                                          int stride,
                                          const CNN_CONFIG *cnn_config,
                                          const CNN_THREAD_DATA *thread_data,
                                          int bit_depth,
                                          CNN_MULTI_OUT *output) {
  const float max_val = (float)((1 << bit_depth) - 1);

  const int in_width = width + 2 * cnn_config->ext_width;
  const int in_height = height + 2 * cnn_config->ext_height;
  const int in_channels = cnn_config->layer_config[0].in_channels;
  float *inputs[CNN_MAX_CHANNELS];
  float *input_ =
      (float *)aom_malloc(in_width * in_height * in_channels * sizeof(*input_));
  if (!input_) return false;
  const int in_stride = in_width;

  for (int c = 0; c < in_channels; ++c) {
    inputs[c] = input_ + c * in_stride * in_height;
    float *input =
        inputs[c] + cnn_config->ext_height * in_stride + cnn_config->ext_width;

    if (cnn_config->strict_bounds) {
      for (int i = 0; i < height; ++i)
        for (int j = 0; j < width; ++j)
          input[i * in_stride + j] = (float)dgd[c][i * stride + j] / max_val;
      // extend left and right
      for (int i = 0; i < height; ++i) {
        for (int j = -cnn_config->ext_width; j < 0; ++j)
          input[i * in_stride + j] = input[i * in_stride];
        for (int j = width; j < width + cnn_config->ext_width; ++j)
          input[i * in_stride + j] = input[i * in_stride + width - 1];
      }
      // extend top and bottom
      for (int i = -cnn_config->ext_height; i < 0; ++i)
        memcpy(&input[i * in_stride - cnn_config->ext_width],
               &input[-cnn_config->ext_width], in_width * sizeof(*input));
      for (int i = height; i < height + cnn_config->ext_height; ++i)
        memcpy(&input[i * in_stride - cnn_config->ext_width],
               &input[(height - 1) * in_stride - cnn_config->ext_width],
               in_width * sizeof(*input));
    } else {
      for (int i = -cnn_config->ext_height; i < height + cnn_config->ext_height;
           ++i)
        for (int j = -cnn_config->ext_width; j < width + cnn_config->ext_width;
             ++j)
          input[i * in_stride + j] = (float)dgd[c][i * stride + j] / max_val;
    }
  }

  bool success = av1_cnn_predict((const float **)inputs, in_width, in_height,
                                 in_stride, cnn_config, thread_data, output);

  aom_free(input_);
  return success;
}